

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

char * telnet_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,
                  Conf *conf,char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  int option;
  _Bool _Var1;
  int iVar2;
  undefined8 *__s;
  Conf *pCVar3;
  strbuf *psVar4;
  char *pcVar5;
  SockAddr *addr;
  char *pcVar6;
  Socket *pSVar7;
  Pinger *pPVar8;
  Opt **ppOVar9;
  undefined8 uVar10;
  Backend *s;
  Opt *pOVar11;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  Backend **local_58;
  Interactor *local_50;
  Seat *local_48;
  LogContext *local_40;
  char *local_38;
  
  local_58 = backend_handle;
  local_48 = seat;
  local_40 = logctx;
  local_38 = host;
  __s = (undefined8 *)safemalloc(1,200,0);
  memset(__s,0,200);
  __s[0x13] = &Telnet_plugvt;
  __s[0x14] = vt;
  local_50 = (Interactor *)(__s + 0x16);
  __s[0x16] = &Telnet_interactorvt;
  __s[0x15] = local_50;
  pCVar3 = conf_copy(conf);
  __s[0x11] = pCVar3;
  *__s = 0;
  *(undefined2 *)(__s + 1) = 0;
  *(undefined2 *)(__s + 0xc) = 0x101;
  *(undefined1 *)((long)__s + 0x62) = 0;
  psVar4 = strbuf_new();
  __s[0xf] = psVar4;
  __s[2] = local_48;
  __s[3] = local_40;
  iVar2 = conf_get_int((Conf *)__s[0x11],0x7d);
  *(int *)(__s + 5) = iVar2;
  iVar2 = conf_get_int((Conf *)__s[0x11],0x7e);
  pcVar6 = local_38;
  *(int *)((long)__s + 0x2c) = iVar2;
  *(undefined4 *)(__s + 0x10) = 0;
  __s[4] = 0;
  __s[0x12] = 0;
  pcVar5 = default_description(vt,local_38,port);
  __s[6] = pcVar5;
  *local_58 = (Backend *)(__s + 0x14);
  iVar2 = conf_get_int((Conf *)__s[0x11],3);
  addr = name_lookup(pcVar6,port,realhost,(Conf *)__s[0x11],iVar2,(LogContext *)__s[3],
                     "Telnet connection");
  pcVar6 = sk_addr_error(addr);
  if (pcVar6 == (char *)0x0) {
    iVar2 = 0x17;
    if (-1 < port) {
      iVar2 = port;
    }
    pSVar7 = new_connection(addr,*realhost,iVar2,false,true,nodelay,keepalive,(Plug *)(__s + 0x13),
                            (Conf *)__s[0x11],local_50);
    *__s = pSVar7;
    pcVar6 = (*pSVar7->vt->socket_error)(pSVar7);
    if (pcVar6 == (char *)0x0) {
      (**(code **)(*(long *)__s[2] + 0xb0))((long *)__s[2],0);
      pPVar8 = pinger_new((Conf *)__s[0x11],(Backend *)(__s + 0x14));
      __s[0x12] = pPVar8;
      _Var1 = conf_get_bool((Conf *)__s[0x11],0x3d);
      if (_Var1) {
        pOVar11 = &o_naws;
        ppOVar9 = opts;
        do {
          ppOVar9 = ppOVar9 + 1;
          *(undefined4 *)((long)__s + (long)pOVar11->index * 4 + 0x38) = 2;
          pOVar11 = *ppOVar9;
        } while (pOVar11 != (Opt *)0x0);
      }
      else {
        local_58 = (Backend **)realhost;
        pOVar11 = &o_naws;
        ppOVar9 = opts;
        do {
          ppOVar9 = ppOVar9 + 1;
          *(anon_enum_32 *)((long)__s + (long)pOVar11->index * 4 + 0x38) = pOVar11->initial_state;
          if (*(int *)((long)__s + (long)pOVar11->index * 4 + 0x38) == 0) {
            iVar2 = pOVar11->send;
            option = pOVar11->option;
            local_5b = 0xff;
            local_5a = (undefined1)iVar2;
            local_59 = (undefined1)option;
            uVar10 = (**(code **)(*(long *)*__s + 0x10))((long *)*__s,&local_5b,3);
            __s[0xd] = uVar10;
            log_option((Telnet *)__s[3],"client",iVar2,option);
          }
          pOVar11 = *ppOVar9;
        } while (pOVar11 != (Opt *)0x0);
        *(undefined1 *)((long)__s + 0x62) = 1;
        realhost = (char **)local_58;
      }
      *(undefined1 *)(__s + 0xe) = 0;
      (**(code **)(*(long *)__s[2] + 0x48))();
      pcVar6 = conf_get_str((Conf *)__s[0x11],9);
      if (*pcVar6 != '\0') {
        safefree((Backend *)*realhost);
        s = (Backend *)dupstr(pcVar6);
        *realhost = (char *)s;
        pcVar6 = host_strrchr((char *)s,0x3a);
        if (pcVar6 != (char *)0x0) {
          *pcVar6 = '\0';
        }
      }
      return (char *)0x0;
    }
  }
  else {
    sk_addr_free(addr);
  }
  pcVar6 = dupstr(pcVar6);
  return pcVar6;
}

Assistant:

static char *telnet_init(const BackendVtable *vt, Seat *seat,
                         Backend **backend_handle, LogContext *logctx,
                         Conf *conf, const char *host, int port,
                         char **realhost, bool nodelay, bool keepalive)
{
    SockAddr *addr;
    const char *err;
    Telnet *telnet;
    char *loghost;
    int addressfamily;

    telnet = snew(Telnet);
    memset(telnet, 0, sizeof(Telnet));
    telnet->plug.vt = &Telnet_plugvt;
    telnet->backend.vt = vt;
    telnet->interactor.vt = &Telnet_interactorvt;
    telnet->backend.interactor = &telnet->interactor;
    telnet->conf = conf_copy(conf);
    telnet->s = NULL;
    telnet->socket_connected = false;
    telnet->closed_on_socket_error = false;
    telnet->echoing = true;
    telnet->editing = true;
    telnet->activated = false;
    telnet->sb_buf = strbuf_new();
    telnet->seat = seat;
    telnet->logctx = logctx;
    telnet->term_width = conf_get_int(telnet->conf, CONF_width);
    telnet->term_height = conf_get_int(telnet->conf, CONF_height);
    telnet->state = TOP_LEVEL;
    telnet->ldisc = NULL;
    telnet->pinger = NULL;
    telnet->description = default_description(vt, host, port);
    *backend_handle = &telnet->backend;

    /*
     * Try to find host.
     */
    addressfamily = conf_get_int(telnet->conf, CONF_addressfamily);
    addr = name_lookup(host, port, realhost, telnet->conf, addressfamily,
                       telnet->logctx, "Telnet connection");
    if ((err = sk_addr_error(addr)) != NULL) {
        sk_addr_free(addr);
        return dupstr(err);
    }

    if (port < 0)
        port = 23;                     /* default telnet port */

    /*
     * Open socket.
     */
    telnet->s = new_connection(addr, *realhost, port, false, true, nodelay,
                               keepalive, &telnet->plug, telnet->conf,
                               &telnet->interactor);
    if ((err = sk_socket_error(telnet->s)) != NULL)
        return dupstr(err);

    /* No local authentication phase in this protocol */
    seat_set_trust_status(telnet->seat, false);

    telnet->pinger = pinger_new(telnet->conf, &telnet->backend);

    /*
     * Initialise option states.
     */
    if (conf_get_bool(telnet->conf, CONF_passive_telnet)) {
        const struct Opt *const *o;

        for (o = opts; *o; o++)
            telnet->opt_states[(*o)->index] = INACTIVE;
    } else {
        const struct Opt *const *o;

        for (o = opts; *o; o++) {
            telnet->opt_states[(*o)->index] = (*o)->initial_state;
            if (telnet->opt_states[(*o)->index] == REQUESTED)
                send_opt(telnet, (*o)->send, (*o)->option);
        }
        telnet->activated = true;
    }

    /*
     * Set up SYNCH state.
     */
    telnet->in_synch = false;

    /*
     * We can send special commands from the start.
     */
    seat_update_specials_menu(telnet->seat);

    /*
     * loghost overrides realhost, if specified.
     */
    loghost = conf_get_str(telnet->conf, CONF_loghost);
    if (*loghost) {
        char *colon;

        sfree(*realhost);
        *realhost = dupstr(loghost);

        colon = host_strrchr(*realhost, ':');
        if (colon)
            *colon++ = '\0';
    }

    return NULL;
}